

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  BVH *bvh;
  NodeRef root;
  Scene *pSVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  float fVar7;
  float fVar8;
  size_t k;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  undefined4 uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar26;
  NodeRef *pNVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar37;
  undefined1 in_ZMM0 [64];
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 ai;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 bi_3;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar60;
  float fVar61;
  vint4 bi_2;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  vint4 bi_1;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 ai_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 ai_3;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  vint4 bi;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar95;
  undefined1 auVar96 [16];
  uint uVar98;
  uint uVar99;
  uint uVar100;
  undefined1 auVar97 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  Precalculations pre;
  undefined1 local_1a28 [16];
  undefined1 local_19f8 [8];
  float fStack_19f0;
  float fStack_19ec;
  undefined1 local_19e8 [8];
  float fStack_19e0;
  float fStack_19dc;
  undefined1 local_19c8 [16];
  RayK<4> *local_19b0;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_1958 [8];
  float fStack_1950;
  float fStack_194c;
  undefined1 local_1948 [8];
  float fStack_1940;
  float fStack_193c;
  undefined1 local_1938 [8];
  float fStack_1930;
  float fStack_192c;
  RTCHitN local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  uint local_1878;
  uint uStack_1874;
  uint uStack_1870;
  uint uStack_186c;
  uint uStack_1868;
  uint uStack_1864;
  uint uStack_1860;
  uint uStack_185c;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined1 local_1838 [16];
  undefined1 local_1828 [16];
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  undefined1 local_1808 [16];
  float local_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar49 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar55 = vpcmpeqd_avx(auVar49,(undefined1  [16])valid_i->field_0);
    auVar43 = ZEXT816(0) << 0x40;
    auVar50 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar43,5);
    auVar36 = auVar55 & auVar50;
    if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar36[0xf] < '\0')
    {
      local_1838 = vandps_avx(auVar50,auVar55);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar101._8_4_ = 0x7fffffff;
      auVar101._0_8_ = 0x7fffffff7fffffff;
      auVar101._12_4_ = 0x7fffffff;
      auVar50 = vandps_avx(auVar101,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar89._8_4_ = 0x219392ef;
      auVar89._0_8_ = 0x219392ef219392ef;
      auVar89._12_4_ = 0x219392ef;
      auVar50 = vcmpps_avx(auVar50,auVar89,1);
      auVar55 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar89,auVar50);
      auVar50 = vandps_avx(auVar101,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar50 = vcmpps_avx(auVar50,auVar89,1);
      auVar36 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar89,auVar50);
      auVar50 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar101);
      auVar50 = vcmpps_avx(auVar50,auVar89,1);
      auVar50 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar89,auVar50);
      auVar63 = vrcpps_avx(auVar55);
      auVar90._8_4_ = 0x3f800000;
      auVar90._0_8_ = 0x3f8000003f800000;
      auVar90._12_4_ = 0x3f800000;
      auVar55 = vfnmadd213ps_fma(auVar55,auVar63,auVar90);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar55,auVar63,auVar63)
      ;
      auVar55 = vrcpps_avx(auVar36);
      auVar36 = vfnmadd213ps_fma(auVar36,auVar55,auVar90);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar36,auVar55,auVar55)
      ;
      auVar55 = vrcpps_avx(auVar50);
      auVar50 = vfnmadd213ps_fma(auVar50,auVar55,auVar90);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar50,auVar55,auVar55)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar43,1);
      auVar55._8_4_ = 0x10;
      auVar55._0_8_ = 0x1000000010;
      auVar55._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar50,auVar55);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar43,5);
      auVar36._8_4_ = 0x20;
      auVar36._0_8_ = 0x2000000020;
      auVar36._12_4_ = 0x20;
      auVar63._8_4_ = 0x30;
      auVar63._0_8_ = 0x3000000030;
      auVar63._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar63,auVar36,auVar50);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar43,5);
      auVar64._8_4_ = 0x40;
      auVar64._0_8_ = 0x4000000040;
      auVar64._12_4_ = 0x40;
      auVar70._8_4_ = 0x50;
      auVar70._0_8_ = 0x5000000050;
      auVar70._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar70,auVar64,auVar50);
      auVar50 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar43);
      auVar55 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar43);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar103 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar50,local_1838);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar50,auVar55,local_1838);
      terminated.field_0.i[1] = local_1838._4_4_ ^ auVar49._4_4_;
      terminated.field_0.i[0] = local_1838._0_4_ ^ auVar49._0_4_;
      terminated.field_0.i[2] = local_1838._8_4_ ^ auVar49._8_4_;
      terminated.field_0.i[3] = local_1838._12_4_ ^ auVar49._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar25 = 3;
      }
      else {
        uVar25 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_19b0 = ray + 0x80;
      pNVar27 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar26 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_1848 = mm_lookupmask_ps._0_8_;
      uStack_1840 = mm_lookupmask_ps._8_8_;
      local_1858 = mm_lookupmask_ps._240_8_;
      uStack_1850 = mm_lookupmask_ps._248_8_;
      auVar50 = vpcmpeqd_avx(local_1838,local_1838);
      auVar97 = ZEXT1664(auVar50);
LAB_004dda2e:
      do {
        do {
          root.ptr = pNVar27[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_004de859;
          pNVar27 = pNVar27 + -1;
          paVar26 = paVar26 + -1;
          aVar38 = *paVar26;
          auVar50 = vcmpps_avx((undefined1  [16])aVar38,(undefined1  [16])tray.tfar.field_0,1);
          uVar16 = vmovmskps_avx(auVar50);
        } while (uVar16 == 0);
        uVar22 = (ulong)(uVar16 & 0xff);
        uVar16 = POPCOUNT(uVar16 & 0xff);
        if (uVar25 < uVar16) {
LAB_004dda6c:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_004de859;
              auVar50 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar38,6);
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar50[0xf]) goto LAB_004dda2e;
              uVar22 = (ulong)((uint)root.ptr & 0xf);
              aVar37 = terminated.field_0;
              if (uVar22 == 8) goto LAB_004de747;
              lVar20 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              uVar19 = 0;
              auVar50 = auVar97._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_004ddc32;
            }
            lVar20 = 0;
            uVar22 = 8;
            aVar38 = auVar103._0_16_;
            do {
              uVar19 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar20 * 8);
              if (uVar19 == 8) break;
              uVar17 = *(undefined4 *)(root.ptr + 0x20 + lVar20 * 4);
              auVar43._4_4_ = uVar17;
              auVar43._0_4_ = uVar17;
              auVar43._8_4_ = uVar17;
              auVar43._12_4_ = uVar17;
              auVar9._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar9._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar9._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar9._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar55 = vfmsub213ps_fma(auVar43,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar9);
              uVar17 = *(undefined4 *)(root.ptr + 0x40 + lVar20 * 4);
              auVar71._4_4_ = uVar17;
              auVar71._0_4_ = uVar17;
              auVar71._8_4_ = uVar17;
              auVar71._12_4_ = uVar17;
              auVar10._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar10._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar10._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar10._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar36 = vfmsub213ps_fma(auVar71,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar10);
              uVar17 = *(undefined4 *)(root.ptr + 0x60 + lVar20 * 4);
              auVar81._4_4_ = uVar17;
              auVar81._0_4_ = uVar17;
              auVar81._8_4_ = uVar17;
              auVar81._12_4_ = uVar17;
              auVar11._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar11._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar11._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar11._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar43 = vfmsub213ps_fma(auVar81,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar11);
              uVar17 = *(undefined4 *)(root.ptr + 0x30 + lVar20 * 4);
              auVar91._4_4_ = uVar17;
              auVar91._0_4_ = uVar17;
              auVar91._8_4_ = uVar17;
              auVar91._12_4_ = uVar17;
              auVar63 = vfmsub213ps_fma(auVar91,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar9);
              uVar17 = *(undefined4 *)(root.ptr + 0x50 + lVar20 * 4);
              auVar65._4_4_ = uVar17;
              auVar65._0_4_ = uVar17;
              auVar65._8_4_ = uVar17;
              auVar65._12_4_ = uVar17;
              auVar64 = vfmsub213ps_fma(auVar65,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar10);
              uVar17 = *(undefined4 *)(root.ptr + 0x70 + lVar20 * 4);
              auVar51._4_4_ = uVar17;
              auVar51._0_4_ = uVar17;
              auVar51._8_4_ = uVar17;
              auVar51._12_4_ = uVar17;
              auVar70 = vfmsub213ps_fma(auVar51,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar11);
              auVar50 = vpminsd_avx(auVar55,auVar63);
              auVar49 = vpminsd_avx(auVar36,auVar64);
              auVar50 = vpmaxsd_avx(auVar50,auVar49);
              auVar49 = vpminsd_avx(auVar43,auVar70);
              auVar49 = vpmaxsd_avx(auVar50,auVar49);
              auVar50 = vpmaxsd_avx(auVar55,auVar63);
              auVar55 = vpmaxsd_avx(auVar36,auVar64);
              auVar55 = vpminsd_avx(auVar50,auVar55);
              auVar50 = vpmaxsd_avx(auVar43,auVar70);
              auVar55 = vpminsd_avx(auVar55,auVar50);
              auVar50 = vpmaxsd_avx(auVar49,(undefined1  [16])tray.tnear.field_0);
              auVar55 = vpminsd_avx(auVar55,(undefined1  [16])tray.tfar.field_0);
              auVar50 = vcmpps_avx(auVar50,auVar55,2);
              uVar21 = uVar22;
              aVar6 = aVar38;
              if (((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar50[0xf] < '\0') &&
                 (aVar6.v = (__m128)vblendvps_avx(auVar103._0_16_,auVar49,auVar50), uVar21 = uVar19,
                 uVar22 != 8)) {
                pNVar27->ptr = uVar22;
                pNVar27 = pNVar27 + 1;
                *paVar26 = aVar38;
                paVar26 = paVar26 + 1;
              }
              aVar38 = aVar6;
              uVar22 = uVar21;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 4);
            if (uVar22 == 8) goto LAB_004de732;
            auVar50 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar38,6);
            uVar17 = vmovmskps_avx(auVar50);
            root.ptr = uVar22;
          } while ((byte)uVar25 < (byte)POPCOUNT(uVar17));
          pNVar27->ptr = uVar22;
          pNVar27 = pNVar27 + 1;
          *paVar26 = aVar38;
          paVar26 = paVar26 + 1;
LAB_004de732:
          iVar18 = 4;
        }
        else {
          do {
            k = 0;
            for (uVar19 = uVar22; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar97 = ZEXT1664(auVar97._0_16_);
            bVar28 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar28) {
              terminated.field_0.i[k] = -1;
            }
            uVar22 = uVar22 - 1 & uVar22;
          } while (uVar22 != 0);
          auVar50 = vpcmpeqd_avx(auVar97._0_16_,auVar97._0_16_);
          auVar97 = ZEXT1664(auVar50);
          auVar50 = auVar50 & ~(undefined1  [16])terminated.field_0;
          iVar18 = 3;
          if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar50[0xf] < '\0') {
            auVar49._8_4_ = 0xff800000;
            auVar49._0_8_ = 0xff800000ff800000;
            auVar49._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar49,
                               (undefined1  [16])terminated.field_0);
            iVar18 = 2;
          }
          auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if (uVar25 < uVar16) goto LAB_004dda6c;
        }
      } while (iVar18 != 3);
LAB_004de859:
      auVar50 = vandps_avx(local_1838,(undefined1  [16])terminated.field_0);
      auVar42._8_4_ = 0xff800000;
      auVar42._0_8_ = 0xff800000ff800000;
      auVar42._12_4_ = 0xff800000;
      auVar50 = vmaskmovps_avx(auVar50,auVar42);
      *(undefined1 (*) [16])local_19b0 = auVar50;
    }
  }
  return;
  while( true ) {
    uVar19 = uVar19 + 1;
    lVar20 = lVar20 + 0x60;
    auVar50 = auVar49;
    if (uVar22 - 8 <= uVar19) break;
LAB_004ddc32:
    pSVar2 = context->scene;
    uVar21 = 0;
    local_1a28 = auVar50;
    while (iVar18 = *(int *)(lVar20 + uVar21 * 4), iVar18 != -1) {
      uVar16 = *(uint *)(lVar20 + -0x10 + uVar21 * 4);
      pfVar3 = (pSVar2->vertices).items[uVar16];
      uVar24 = (ulong)*(uint *)(lVar20 + -0x50 + uVar21 * 4);
      uVar23 = (ulong)*(uint *)(lVar20 + -0x40 + uVar21 * 4);
      fVar56 = pfVar3[uVar24];
      auVar72._4_4_ = fVar56;
      auVar72._0_4_ = fVar56;
      auVar72._8_4_ = fVar56;
      auVar72._12_4_ = fVar56;
      fVar60 = pfVar3[uVar24 + 1];
      auVar75._4_4_ = fVar60;
      auVar75._0_4_ = fVar60;
      auVar75._8_4_ = fVar60;
      auVar75._12_4_ = fVar60;
      fVar61 = pfVar3[uVar24 + 2];
      auVar82._4_4_ = fVar61;
      auVar82._0_4_ = fVar61;
      auVar82._8_4_ = fVar61;
      auVar82._12_4_ = fVar61;
      local_19f8._4_4_ = pfVar3[uVar23];
      local_19e8._4_4_ = pfVar3[uVar23 + 1];
      local_1938._4_4_ = pfVar3[uVar23 + 2];
      uVar23 = (ulong)*(uint *)(lVar20 + -0x20 + uVar21 * 4);
      local_1948._4_4_ = pfVar3[uVar23];
      local_1958._4_4_ = pfVar3[uVar23 + 1];
      local_17f8 = pfVar3[uVar23 + 2];
      local_19f8._0_4_ = local_19f8._4_4_;
      fStack_19f0 = (float)local_19f8._4_4_;
      fStack_19ec = (float)local_19f8._4_4_;
      fVar62 = fVar56 - (float)local_19f8._4_4_;
      auVar57._4_4_ = fVar62;
      auVar57._0_4_ = fVar62;
      auVar57._8_4_ = fVar62;
      auVar57._12_4_ = fVar62;
      local_19e8._0_4_ = local_19e8._4_4_;
      fStack_19e0 = (float)local_19e8._4_4_;
      fStack_19dc = (float)local_19e8._4_4_;
      fVar7 = fVar60 - (float)local_19e8._4_4_;
      local_1938._0_4_ = local_1938._4_4_;
      fStack_1930 = (float)local_1938._4_4_;
      fStack_192c = (float)local_1938._4_4_;
      fVar8 = fVar61 - (float)local_1938._4_4_;
      auVar104._4_4_ = fVar8;
      auVar104._0_4_ = fVar8;
      auVar104._8_4_ = fVar8;
      auVar104._12_4_ = fVar8;
      local_1948._0_4_ = local_1948._4_4_;
      fStack_1940 = (float)local_1948._4_4_;
      fStack_193c = (float)local_1948._4_4_;
      fVar56 = (float)local_1948._4_4_ - fVar56;
      auVar66._4_4_ = fVar56;
      auVar66._0_4_ = fVar56;
      auVar66._8_4_ = fVar56;
      auVar66._12_4_ = fVar56;
      fVar56 = fVar56 * fVar8;
      local_1958._0_4_ = local_1958._4_4_;
      fStack_1950 = (float)local_1958._4_4_;
      fStack_194c = (float)local_1958._4_4_;
      fVar60 = (float)local_1958._4_4_ - fVar60;
      fVar62 = fVar60 * fVar62;
      auVar96._4_4_ = fVar60;
      auVar96._0_4_ = fVar60;
      auVar96._8_4_ = fVar60;
      auVar96._12_4_ = fVar60;
      auVar86._4_4_ = fVar7;
      auVar86._0_4_ = fVar7;
      auVar86._8_4_ = fVar7;
      auVar86._12_4_ = fVar7;
      fVar61 = local_17f8 - fVar61;
      fVar7 = fVar7 * fVar61;
      auVar102._4_4_ = fVar61;
      auVar102._0_4_ = fVar61;
      auVar102._8_4_ = fVar61;
      auVar102._12_4_ = fVar61;
      auVar29._4_4_ = fVar7;
      auVar29._0_4_ = fVar7;
      auVar29._8_4_ = fVar7;
      auVar29._12_4_ = fVar7;
      auVar89 = vfmsub231ps_fma(auVar29,auVar96,auVar104);
      auVar39._4_4_ = fVar56;
      auVar39._0_4_ = fVar56;
      auVar39._8_4_ = fVar56;
      auVar39._12_4_ = fVar56;
      auVar90 = vfmsub231ps_fma(auVar39,auVar102,auVar57);
      auVar44._4_4_ = fVar62;
      auVar44._0_4_ = fVar62;
      auVar44._8_4_ = fVar62;
      auVar44._12_4_ = fVar62;
      auVar43 = vsubps_avx(auVar72,*(undefined1 (*) [16])ray);
      auVar63 = vsubps_avx(auVar75,*(undefined1 (*) [16])(ray + 0x10));
      auVar9 = vfmsub231ps_fma(auVar44,auVar66,auVar86);
      auVar64 = vsubps_avx(auVar82,*(undefined1 (*) [16])(ray + 0x20));
      auVar49 = *(undefined1 (*) [16])(ray + 0x40);
      auVar55 = *(undefined1 (*) [16])(ray + 0x50);
      auVar105._0_4_ = auVar49._0_4_ * auVar63._0_4_;
      auVar105._4_4_ = auVar49._4_4_ * auVar63._4_4_;
      auVar105._8_4_ = auVar49._8_4_ * auVar63._8_4_;
      auVar105._12_4_ = auVar49._12_4_ * auVar63._12_4_;
      auVar10 = vfmsub231ps_fma(auVar105,auVar43,auVar55);
      auVar36 = *(undefined1 (*) [16])(ray + 0x60);
      auVar83._0_4_ = auVar36._0_4_ * auVar9._0_4_;
      auVar83._4_4_ = auVar36._4_4_ * auVar9._4_4_;
      auVar83._8_4_ = auVar36._8_4_ * auVar9._8_4_;
      auVar83._12_4_ = auVar36._12_4_ * auVar9._12_4_;
      auVar70 = vfmadd231ps_fma(auVar83,auVar90,auVar55);
      auVar107._0_4_ = auVar55._0_4_ * auVar64._0_4_;
      auVar107._4_4_ = auVar55._4_4_ * auVar64._4_4_;
      auVar107._8_4_ = auVar55._8_4_ * auVar64._8_4_;
      auVar107._12_4_ = auVar55._12_4_ * auVar64._12_4_;
      auVar11 = vfmsub231ps_fma(auVar107,auVar63,auVar36);
      auVar109._0_4_ = auVar36._0_4_ * auVar43._0_4_;
      auVar109._4_4_ = auVar36._4_4_ * auVar43._4_4_;
      auVar109._8_4_ = auVar36._8_4_ * auVar43._8_4_;
      auVar109._12_4_ = auVar36._12_4_ * auVar43._12_4_;
      auVar51 = vfmsub231ps_fma(auVar109,auVar64,auVar49);
      auVar70 = vfmadd231ps_fma(auVar70,auVar89,auVar49);
      auVar52._0_4_ = fVar61 * auVar10._0_4_;
      auVar52._4_4_ = fVar61 * auVar10._4_4_;
      auVar52._8_4_ = fVar61 * auVar10._8_4_;
      auVar52._12_4_ = fVar61 * auVar10._12_4_;
      auVar49 = vfmadd231ps_fma(auVar52,auVar51,auVar96);
      auVar55 = vfmadd231ps_fma(auVar49,auVar11,auVar66);
      local_1808._8_4_ = 0x80000000;
      local_1808._0_8_ = 0x8000000080000000;
      local_1808._12_4_ = 0x80000000;
      uVar23 = (ulong)*(uint *)(lVar20 + -0x30 + uVar21 * 4);
      auVar49 = vandps_avx(auVar70,local_1808);
      uVar95 = auVar49._0_4_;
      auVar87._0_4_ = (float)(uVar95 ^ auVar55._0_4_);
      uVar98 = auVar49._4_4_;
      auVar87._4_4_ = (float)(uVar98 ^ auVar55._4_4_);
      uVar99 = auVar49._8_4_;
      auVar87._8_4_ = (float)(uVar99 ^ auVar55._8_4_);
      uVar100 = auVar49._12_4_;
      auVar87._12_4_ = (float)(uVar100 ^ auVar55._12_4_);
      auVar55 = vcmpps_avx(auVar87,_DAT_01f7aa10,5);
      auVar36 = local_1a28 & auVar55;
      local_1818 = pfVar3[uVar23];
      fVar56 = pfVar3[uVar23 + 1];
      auVar58._4_4_ = fVar56;
      auVar58._0_4_ = fVar56;
      auVar58._8_4_ = fVar56;
      auVar58._12_4_ = fVar56;
      fVar56 = pfVar3[uVar23 + 2];
      local_1828._4_4_ = fVar56;
      local_1828._0_4_ = fVar56;
      local_1828._8_4_ = fVar56;
      local_1828._12_4_ = fVar56;
      fStack_1814 = local_1818;
      fStack_1810 = local_1818;
      fStack_180c = local_1818;
      fStack_17f4 = local_17f8;
      fStack_17f0 = local_17f8;
      fStack_17ec = local_17f8;
      if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar36[0xf] < '\0'
         ) {
        auVar55 = vandps_avx(auVar55,local_1a28);
        auVar53._0_4_ = auVar10._0_4_ * fVar8;
        auVar53._4_4_ = auVar10._4_4_ * fVar8;
        auVar53._8_4_ = auVar10._8_4_ * fVar8;
        auVar53._12_4_ = auVar10._12_4_ * fVar8;
        auVar36 = vfmadd213ps_fma(auVar86,auVar51,auVar53);
        auVar36 = vfmadd213ps_fma(auVar57,auVar11,auVar36);
        auVar88._0_4_ = (float)(uVar95 ^ auVar36._0_4_);
        auVar88._4_4_ = (float)(uVar98 ^ auVar36._4_4_);
        auVar88._8_4_ = (float)(uVar99 ^ auVar36._8_4_);
        auVar88._12_4_ = (float)(uVar100 ^ auVar36._12_4_);
        auVar36 = vcmpps_avx(auVar88,_DAT_01f7aa10,5);
        auVar10 = auVar55 & auVar36;
        if ((((auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar10[0xf] < '\0') {
          auVar10 = vandps_avx(auVar70,auVar101);
          auVar55 = vandps_avx(auVar55,auVar36);
          auVar36 = vsubps_avx(auVar10,auVar87);
          auVar36 = vcmpps_avx(auVar36,auVar88,5);
          auVar11 = auVar55 & auVar36;
          if ((((auVar11 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar11[0xf] < '\0') {
            auVar55 = vandps_avx(auVar36,auVar55);
            auVar92._0_4_ = auVar64._0_4_ * auVar9._0_4_;
            auVar92._4_4_ = auVar64._4_4_ * auVar9._4_4_;
            auVar92._8_4_ = auVar64._8_4_ * auVar9._8_4_;
            auVar92._12_4_ = auVar64._12_4_ * auVar9._12_4_;
            auVar36 = vfmadd213ps_fma(auVar63,auVar90,auVar92);
            auVar36 = vfmadd213ps_fma(auVar43,auVar89,auVar36);
            auVar74._0_4_ = (float)(uVar95 ^ auVar36._0_4_);
            auVar74._4_4_ = (float)(uVar98 ^ auVar36._4_4_);
            auVar74._8_4_ = (float)(uVar99 ^ auVar36._8_4_);
            auVar74._12_4_ = (float)(uVar100 ^ auVar36._12_4_);
            auVar78._0_4_ = auVar10._0_4_ * *(float *)(ray + 0x30);
            auVar78._4_4_ = auVar10._4_4_ * *(float *)(ray + 0x34);
            auVar78._8_4_ = auVar10._8_4_ * *(float *)(ray + 0x38);
            auVar78._12_4_ = auVar10._12_4_ * *(float *)(ray + 0x3c);
            auVar36 = vcmpps_avx(auVar78,auVar74,1);
            pRVar1 = ray + 0x80;
            auVar63 = *(undefined1 (*) [16])pRVar1;
            auVar93._0_4_ = *(float *)pRVar1 * auVar10._0_4_;
            auVar93._4_4_ = *(float *)(ray + 0x84) * auVar10._4_4_;
            auVar93._8_4_ = *(float *)(ray + 0x88) * auVar10._8_4_;
            auVar93._12_4_ = *(float *)(ray + 0x8c) * auVar10._12_4_;
            auVar43 = vcmpps_avx(auVar74,auVar93,2);
            auVar36 = vandps_avx(auVar43,auVar36);
            auVar43 = auVar55 & auVar36;
            if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar43[0xf] < '\0') {
              auVar55 = vandps_avx(auVar36,auVar55);
              auVar36 = vcmpps_avx(auVar70,_DAT_01f7aa10,4);
              auVar43 = auVar55 & auVar36;
              if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar43[0xf] < '\0') {
                auVar55 = vandps_avx(auVar36,auVar55);
                pGVar4 = (context->scene->geometries).items[uVar16].ptr;
                uVar95 = pGVar4->mask;
                auVar79._4_4_ = uVar95;
                auVar79._0_4_ = uVar95;
                auVar79._8_4_ = uVar95;
                auVar79._12_4_ = uVar95;
                auVar36 = vpand_avx(auVar79,*(undefined1 (*) [16])(ray + 0x90));
                auVar36 = vpcmpeqd_avx(auVar36,_DAT_01f7aa10);
                auVar43 = auVar55 & ~auVar36;
                if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar43[0xf] < '\0') {
                  auVar55 = vandnps_avx(auVar36,auVar55);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar36 = vrcpps_avx(auVar10);
                    auVar94._8_4_ = 0x3f800000;
                    auVar94._0_8_ = 0x3f8000003f800000;
                    auVar94._12_4_ = 0x3f800000;
                    auVar43 = vfnmadd213ps_fma(auVar10,auVar36,auVar94);
                    auVar36 = vfmadd132ps_fma(auVar43,auVar36,auVar36);
                    fVar56 = auVar36._0_4_;
                    auVar69._0_4_ = fVar56 * auVar87._0_4_;
                    fVar60 = auVar36._4_4_;
                    auVar69._4_4_ = fVar60 * auVar87._4_4_;
                    fVar61 = auVar36._8_4_;
                    auVar69._8_4_ = fVar61 * auVar87._8_4_;
                    fVar62 = auVar36._12_4_;
                    auVar69._12_4_ = fVar62 * auVar87._12_4_;
                    auVar36 = vminps_avx(auVar69,auVar94);
                    auVar80._0_4_ = auVar88._0_4_ * fVar56;
                    auVar80._4_4_ = auVar88._4_4_ * fVar60;
                    auVar80._8_4_ = auVar88._8_4_ * fVar61;
                    auVar80._12_4_ = auVar88._12_4_ * fVar62;
                    auVar43 = vminps_avx(auVar80,auVar94);
                    auVar64 = vsubps_avx(auVar94,auVar36);
                    auVar70 = vsubps_avx(auVar94,auVar43);
                    auVar13._8_8_ = uStack_1840;
                    auVar13._0_8_ = local_1848;
                    local_18b8 = vblendvps_avx(auVar36,auVar64,auVar13);
                    local_18a8 = vblendvps_avx(auVar43,auVar70,auVar13);
                    local_1888._4_4_ = uVar16;
                    local_1888._0_4_ = uVar16;
                    local_1888._8_4_ = uVar16;
                    local_1888._12_4_ = uVar16;
                    local_1898._4_4_ = iVar18;
                    local_1898._0_4_ = iVar18;
                    local_1898._8_4_ = iVar18;
                    local_1898._12_4_ = iVar18;
                    vpcmpeqd_avx2(ZEXT1632(auVar89),ZEXT1632(auVar89));
                    uStack_1874 = context->user->instID[0];
                    local_1878 = uStack_1874;
                    uStack_1870 = uStack_1874;
                    uStack_186c = uStack_1874;
                    uStack_1868 = context->user->instPrimID[0];
                    auVar41._0_4_ = fVar56 * auVar74._0_4_;
                    auVar41._4_4_ = fVar60 * auVar74._4_4_;
                    auVar41._8_4_ = fVar61 * auVar74._8_4_;
                    auVar41._12_4_ = fVar62 * auVar74._12_4_;
                    uStack_1864 = uStack_1868;
                    uStack_1860 = uStack_1868;
                    uStack_185c = uStack_1868;
                    auVar36 = vblendvps_avx(*(undefined1 (*) [16])pRVar1,auVar41,auVar55);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar36;
                    args.valid = (int *)local_19c8;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = local_18e8;
                    args.N = 4;
                    local_19c8 = auVar55;
                    args.ray = (RTCRayN *)ray;
                    local_18e8 = (RTCHitN  [16])auVar89;
                    local_18d8 = auVar90;
                    local_18c8 = auVar9;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&args);
                    }
                    if (local_19c8 == (undefined1  [16])0x0) {
                      auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar55 = auVar55 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                      }
                      auVar36 = vpcmpeqd_avx(local_19c8,_DAT_01f7aa10);
                      auVar55 = auVar36 ^ _DAT_01f7ae20;
                      auVar47._8_4_ = 0xff800000;
                      auVar47._0_8_ = 0xff800000ff800000;
                      auVar47._12_4_ = 0xff800000;
                      auVar36 = vblendvps_avx(auVar47,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar36);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar36;
                    }
                    auVar36 = vpslld_avx(auVar55,0x1f);
                    auVar55 = vpsrad_avx(auVar36,0x1f);
                    auVar36 = vblendvps_avx(auVar63,*(undefined1 (*) [16])local_19b0,auVar36);
                    *(undefined1 (*) [16])local_19b0 = auVar36;
                  }
                  local_1a28 = vpandn_avx(auVar55,local_1a28);
                }
              }
            }
          }
        }
      }
      if ((((local_1a28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (local_1a28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (local_1a28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < local_1a28[0xf]) {
        auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar49 = vpcmpeqd_avx(auVar49,auVar49);
        auVar97 = ZEXT1664(auVar49);
        break;
      }
      auVar14._4_4_ = fStack_1814;
      auVar14._0_4_ = local_1818;
      auVar14._8_4_ = fStack_1810;
      auVar14._12_4_ = fStack_180c;
      auVar43 = vsubps_avx(auVar14,_local_1948);
      auVar63 = vsubps_avx(auVar58,_local_1958);
      auVar15._4_4_ = fStack_17f4;
      auVar15._0_4_ = local_17f8;
      auVar15._8_4_ = fStack_17f0;
      auVar15._12_4_ = fStack_17ec;
      auVar64 = vsubps_avx(local_1828,auVar15);
      auVar70 = vsubps_avx(_local_19f8,auVar14);
      auVar89 = vsubps_avx(_local_19e8,auVar58);
      auVar90 = vsubps_avx(_local_1938,local_1828);
      auVar45._0_4_ = auVar63._0_4_ * auVar90._0_4_;
      auVar45._4_4_ = auVar63._4_4_ * auVar90._4_4_;
      auVar45._8_4_ = auVar63._8_4_ * auVar90._8_4_;
      auVar45._12_4_ = auVar63._12_4_ * auVar90._12_4_;
      auVar65 = vfmsub231ps_fma(auVar45,auVar89,auVar64);
      auVar59._0_4_ = auVar64._0_4_ * auVar70._0_4_;
      auVar59._4_4_ = auVar64._4_4_ * auVar70._4_4_;
      auVar59._8_4_ = auVar64._8_4_ * auVar70._8_4_;
      auVar59._12_4_ = auVar64._12_4_ * auVar70._12_4_;
      auVar71 = vfmsub231ps_fma(auVar59,auVar90,auVar43);
      auVar76._0_4_ = auVar89._0_4_ * auVar43._0_4_;
      auVar76._4_4_ = auVar89._4_4_ * auVar43._4_4_;
      auVar76._8_4_ = auVar89._8_4_ * auVar43._8_4_;
      auVar76._12_4_ = auVar89._12_4_ * auVar43._12_4_;
      auVar9 = vsubps_avx(auVar14,*(undefined1 (*) [16])ray);
      auVar10 = vsubps_avx(auVar58,*(undefined1 (*) [16])(ray + 0x10));
      auVar11 = vsubps_avx(local_1828,*(undefined1 (*) [16])(ray + 0x20));
      auVar81 = vfmsub231ps_fma(auVar76,auVar70,auVar63);
      auVar49 = *(undefined1 (*) [16])(ray + 0x40);
      auVar55 = *(undefined1 (*) [16])(ray + 0x50);
      auVar106._0_4_ = auVar49._0_4_ * auVar10._0_4_;
      auVar106._4_4_ = auVar49._4_4_ * auVar10._4_4_;
      auVar106._8_4_ = auVar49._8_4_ * auVar10._8_4_;
      auVar106._12_4_ = auVar49._12_4_ * auVar10._12_4_;
      auVar91 = vfmsub231ps_fma(auVar106,auVar9,auVar55);
      auVar36 = *(undefined1 (*) [16])(ray + 0x60);
      auVar84._0_4_ = auVar36._0_4_ * auVar81._0_4_;
      auVar84._4_4_ = auVar36._4_4_ * auVar81._4_4_;
      auVar84._8_4_ = auVar36._8_4_ * auVar81._8_4_;
      auVar84._12_4_ = auVar36._12_4_ * auVar81._12_4_;
      auVar51 = vfmadd231ps_fma(auVar84,auVar71,auVar55);
      auVar108._0_4_ = auVar55._0_4_ * auVar11._0_4_;
      auVar108._4_4_ = auVar55._4_4_ * auVar11._4_4_;
      auVar108._8_4_ = auVar55._8_4_ * auVar11._8_4_;
      auVar108._12_4_ = auVar55._12_4_ * auVar11._12_4_;
      auVar29 = vfmsub231ps_fma(auVar108,auVar10,auVar36);
      auVar110._0_4_ = auVar36._0_4_ * auVar9._0_4_;
      auVar110._4_4_ = auVar36._4_4_ * auVar9._4_4_;
      auVar110._8_4_ = auVar36._8_4_ * auVar9._8_4_;
      auVar110._12_4_ = auVar36._12_4_ * auVar9._12_4_;
      auVar39 = vfmsub231ps_fma(auVar110,auVar11,auVar49);
      auVar51 = vfmadd231ps_fma(auVar51,auVar65,auVar49);
      auVar30._0_4_ = auVar90._0_4_ * auVar91._0_4_;
      auVar30._4_4_ = auVar90._4_4_ * auVar91._4_4_;
      auVar30._8_4_ = auVar90._8_4_ * auVar91._8_4_;
      auVar30._12_4_ = auVar90._12_4_ * auVar91._12_4_;
      auVar55 = vfmadd231ps_fma(auVar30,auVar39,auVar89);
      auVar49 = vandps_avx(auVar51,local_1808);
      auVar55 = vfmadd231ps_fma(auVar55,auVar29,auVar70);
      uVar16 = auVar49._0_4_;
      auVar67._0_4_ = (float)(uVar16 ^ auVar55._0_4_);
      uVar95 = auVar49._4_4_;
      auVar67._4_4_ = (float)(uVar95 ^ auVar55._4_4_);
      uVar98 = auVar49._8_4_;
      auVar67._8_4_ = (float)(uVar98 ^ auVar55._8_4_);
      uVar99 = auVar49._12_4_;
      auVar67._12_4_ = (float)(uVar99 ^ auVar55._12_4_);
      auVar55 = vcmpps_avx(auVar67,_DAT_01f7aa10,5);
      auVar36 = local_1a28 & auVar55;
      if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar36[0xf] < '\0'
         ) {
        auVar55 = vandps_avx(auVar55,local_1a28);
        auVar31._0_4_ = auVar64._0_4_ * auVar91._0_4_;
        auVar31._4_4_ = auVar64._4_4_ * auVar91._4_4_;
        auVar31._8_4_ = auVar64._8_4_ * auVar91._8_4_;
        auVar31._12_4_ = auVar64._12_4_ * auVar91._12_4_;
        auVar36 = vfmadd213ps_fma(auVar63,auVar39,auVar31);
        auVar36 = vfmadd213ps_fma(auVar43,auVar29,auVar36);
        auVar77._0_4_ = (float)(uVar16 ^ auVar36._0_4_);
        auVar77._4_4_ = (float)(uVar95 ^ auVar36._4_4_);
        auVar77._8_4_ = (float)(uVar98 ^ auVar36._8_4_);
        auVar77._12_4_ = (float)(uVar99 ^ auVar36._12_4_);
        auVar36 = vcmpps_avx(auVar77,_DAT_01f7aa10,5);
        auVar43 = auVar55 & auVar36;
        if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar43[0xf] < '\0') {
          auVar43 = vandps_avx(auVar51,auVar101);
          auVar55 = vandps_avx(auVar36,auVar55);
          auVar36 = vsubps_avx(auVar43,auVar67);
          auVar36 = vcmpps_avx(auVar36,auVar77,5);
          auVar63 = auVar55 & auVar36;
          if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar63[0xf] < '\0') {
            auVar55 = vandps_avx(auVar36,auVar55);
            auVar32._0_4_ = auVar11._0_4_ * auVar81._0_4_;
            auVar32._4_4_ = auVar11._4_4_ * auVar81._4_4_;
            auVar32._8_4_ = auVar11._8_4_ * auVar81._8_4_;
            auVar32._12_4_ = auVar11._12_4_ * auVar81._12_4_;
            auVar36 = vfmadd132ps_fma(auVar10,auVar32,auVar71);
            auVar36 = vfmadd132ps_fma(auVar9,auVar36,auVar65);
            auVar73._0_4_ = (float)(uVar16 ^ auVar36._0_4_);
            auVar73._4_4_ = (float)(uVar95 ^ auVar36._4_4_);
            auVar73._8_4_ = (float)(uVar98 ^ auVar36._8_4_);
            auVar73._12_4_ = (float)(uVar99 ^ auVar36._12_4_);
            auVar33._0_4_ = auVar43._0_4_ * *(float *)(ray + 0x30);
            auVar33._4_4_ = auVar43._4_4_ * *(float *)(ray + 0x34);
            auVar33._8_4_ = auVar43._8_4_ * *(float *)(ray + 0x38);
            auVar33._12_4_ = auVar43._12_4_ * *(float *)(ray + 0x3c);
            auVar36 = vcmpps_avx(auVar33,auVar73,1);
            auVar64 = *(undefined1 (*) [16])(ray + 0x80);
            auVar54._0_4_ = auVar43._0_4_ * *(float *)(ray + 0x80);
            auVar54._4_4_ = auVar43._4_4_ * *(float *)(ray + 0x84);
            auVar54._8_4_ = auVar43._8_4_ * *(float *)(ray + 0x88);
            auVar54._12_4_ = auVar43._12_4_ * *(float *)(ray + 0x8c);
            auVar63 = vcmpps_avx(auVar73,auVar54,2);
            auVar36 = vandps_avx(auVar63,auVar36);
            auVar63 = auVar55 & auVar36;
            if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              auVar55 = vandps_avx(auVar55,auVar36);
              auVar36 = vcmpps_avx(auVar51,_DAT_01f7aa10,4);
              auVar63 = auVar55 & auVar36;
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar63[0xf] < '\0') {
                auVar55 = vandps_avx(auVar36,auVar55);
                uVar95 = *(uint *)(lVar20 + -0x10 + uVar21 * 4);
                pGVar4 = (context->scene->geometries).items[uVar95].ptr;
                uVar16 = pGVar4->mask;
                auVar34._4_4_ = uVar16;
                auVar34._0_4_ = uVar16;
                auVar34._8_4_ = uVar16;
                auVar34._12_4_ = uVar16;
                auVar36 = vpand_avx(auVar34,*(undefined1 (*) [16])(ray + 0x90));
                auVar36 = vpcmpeqd_avx(auVar36,_DAT_01f7aa10);
                auVar63 = auVar55 & ~auVar36;
                if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar63[0xf] < '\0') {
                  uVar17 = *(undefined4 *)(lVar20 + uVar21 * 4);
                  auVar55 = vandnps_avx(auVar36,auVar55);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar36 = vrcpps_avx(auVar43);
                    auVar85._8_4_ = 0x3f800000;
                    auVar85._0_8_ = 0x3f8000003f800000;
                    auVar85._12_4_ = 0x3f800000;
                    auVar43 = vfnmadd213ps_fma(auVar43,auVar36,auVar85);
                    auVar36 = vfmadd132ps_fma(auVar43,auVar36,auVar36);
                    fVar56 = auVar36._0_4_;
                    auVar35._0_4_ = fVar56 * auVar67._0_4_;
                    fVar60 = auVar36._4_4_;
                    auVar35._4_4_ = fVar60 * auVar67._4_4_;
                    fVar61 = auVar36._8_4_;
                    auVar35._8_4_ = fVar61 * auVar67._8_4_;
                    fVar62 = auVar36._12_4_;
                    auVar35._12_4_ = fVar62 * auVar67._12_4_;
                    auVar36 = vminps_avx(auVar35,auVar85);
                    auVar68._0_4_ = fVar56 * auVar77._0_4_;
                    auVar68._4_4_ = fVar60 * auVar77._4_4_;
                    auVar68._8_4_ = fVar61 * auVar77._8_4_;
                    auVar68._12_4_ = fVar62 * auVar77._12_4_;
                    auVar43 = vminps_avx(auVar68,auVar85);
                    auVar63 = vsubps_avx(auVar85,auVar36);
                    auVar70 = vsubps_avx(auVar85,auVar43);
                    auVar12._8_8_ = uStack_1850;
                    auVar12._0_8_ = local_1858;
                    local_18b8 = vblendvps_avx(auVar36,auVar63,auVar12);
                    local_18a8 = vblendvps_avx(auVar43,auVar70,auVar12);
                    local_1888._4_4_ = uVar95;
                    local_1888._0_4_ = uVar95;
                    local_1888._8_4_ = uVar95;
                    local_1888._12_4_ = uVar95;
                    local_1898._4_4_ = uVar17;
                    local_1898._0_4_ = uVar17;
                    local_1898._8_4_ = uVar17;
                    local_1898._12_4_ = uVar17;
                    vpcmpeqd_avx2(ZEXT1632(local_18b8),ZEXT1632(local_18b8));
                    uStack_1874 = context->user->instID[0];
                    local_1878 = uStack_1874;
                    uStack_1870 = uStack_1874;
                    uStack_186c = uStack_1874;
                    uStack_1868 = context->user->instPrimID[0];
                    auVar40._0_4_ = fVar56 * auVar73._0_4_;
                    auVar40._4_4_ = fVar60 * auVar73._4_4_;
                    auVar40._8_4_ = fVar61 * auVar73._8_4_;
                    auVar40._12_4_ = fVar62 * auVar73._12_4_;
                    uStack_1864 = uStack_1868;
                    uStack_1860 = uStack_1868;
                    uStack_185c = uStack_1868;
                    auVar36 = vblendvps_avx(auVar64,auVar40,auVar55);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar36;
                    args.valid = (int *)local_19c8;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = local_18e8;
                    args.N = 4;
                    local_19c8 = auVar55;
                    args.ray = (RTCRayN *)ray;
                    local_18e8 = (RTCHitN  [16])auVar65;
                    local_18d8 = auVar71;
                    local_18c8 = auVar81;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&args);
                    }
                    if (local_19c8 == (undefined1  [16])0x0) {
                      auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar55 = auVar55 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                      }
                      auVar36 = vpcmpeqd_avx(local_19c8,_DAT_01f7aa10);
                      auVar55 = auVar36 ^ _DAT_01f7ae20;
                      auVar46._8_4_ = 0xff800000;
                      auVar46._0_8_ = 0xff800000ff800000;
                      auVar46._12_4_ = 0xff800000;
                      auVar36 = vblendvps_avx(auVar46,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar36);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar36;
                    }
                    auVar36 = vpslld_avx(auVar55,0x1f);
                    auVar55 = vpsrad_avx(auVar36,0x1f);
                    auVar36 = vblendvps_avx(auVar64,*(undefined1 (*) [16])local_19b0,auVar36);
                    *(undefined1 (*) [16])local_19b0 = auVar36;
                  }
                  local_1a28 = vpandn_avx(auVar55,local_1a28);
                }
              }
            }
          }
        }
      }
      auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar49 = vpcmpeqd_avx(auVar49,auVar49);
      auVar97 = ZEXT1664(auVar49);
      if (((((local_1a28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (local_1a28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (local_1a28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           -1 < local_1a28[0xf]) || (bVar28 = 2 < uVar21, uVar21 = uVar21 + 1, bVar28)) break;
    }
    auVar49 = vandps_avx(local_1a28,auVar50);
    auVar50 = auVar50 & local_1a28;
    if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar50[0xf])
    break;
  }
  aVar37._0_4_ = auVar97._0_4_ ^ auVar49._0_4_;
  aVar37._4_4_ = auVar97._4_4_ ^ auVar49._4_4_;
  aVar37._8_4_ = auVar97._8_4_ ^ auVar49._8_4_;
  aVar37._12_4_ = auVar97._12_4_ ^ auVar49._12_4_;
LAB_004de747:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar37);
  auVar50 = auVar97._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar50[0xf])
  goto LAB_004de859;
  auVar48._8_4_ = 0xff800000;
  auVar48._0_8_ = 0xff800000ff800000;
  auVar48._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar48,
                     (undefined1  [16])terminated.field_0);
  goto LAB_004dda2e;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }